

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow_cutter.h
# Opt level: O0

int __thiscall
flow_cutter::PierceNodeScore::operator()
          (PierceNodeScore *this,int x,int side,bool causes_augmenting_path,int source_dist,
          int target_dist,int cutter_id)

{
  byte in_CL;
  long in_RDI;
  int in_R8D;
  uint in_R9D;
  int score;
  anon_class_24_3_0fdba398 random_number;
  uint local_3c;
  anon_class_24_3_0fdba398 local_38;
  byte local_11;
  int local_10;
  int local_c [3];
  
  local_11 = in_CL & 1;
  local_38.side = &local_10;
  local_38.x = local_c;
  switch(*(undefined4 *)(in_RDI + 0x28)) {
  case 0:
    local_3c = in_R9D - in_R8D;
    break;
  case 1:
    local_3c = -in_R8D;
    break;
  case 2:
    local_3c = in_R9D;
    break;
  case 3:
    local_3c = operator()::anon_class_24_3_0fdba398::operator()(&local_38);
    break;
  case 4:
    local_3c = 0;
    break;
  default:
    local_3c = 0;
  }
  switch(*(undefined4 *)(in_RDI + 0x24)) {
  case 0:
    if ((local_11 & 1) != 0) {
      local_3c = local_3c + 0xc4653600;
    }
    break;
  case 1:
    break;
  case 2:
    if ((local_11 & 1) != 0) {
      local_3c = 0xc4653600;
    }
    break;
  case 3:
    if ((local_11 & 1) != 0) {
      local_3c = operator()::anon_class_24_3_0fdba398::operator()(&local_38);
      local_3c = local_3c + 0xc4653600;
    }
    break;
  default:
    local_3c = 0;
  }
  return local_3c;
}

Assistant:

int operator()(int x, int side, bool causes_augmenting_path, int source_dist,
        int target_dist, int cutter_id) const
    {

        auto random_number = [&] {
            if (side == BasicCutter::source_side)
                return (hash_factor * (unsigned)(x << 1) + hash_offset) % hash_modulo;
            else
                return (hash_factor * ((unsigned)(x << 1) + 1) + hash_offset) % hash_modulo;
        };

        int score;
        switch (config.pierce_rating) {
        case Config::PierceRating::max_target_minus_source_hop_dist:
            score = target_dist - source_dist;
            break;
        case Config::PierceRating::max_target_hop_dist:
            score = target_dist;
            break;
        case Config::PierceRating::min_source_hop_dist:
            score = -source_dist;
            break;
        case Config::PierceRating::oldest:
            score = 0;
            break;
        case Config::PierceRating::random:
            score = random_number();
            break;

        default:
            assert(false);
            score = 0;
        }
        switch (config.avoid_augmenting_path) {
        case Config::AvoidAugmentingPath::avoid_and_pick_best:
            if (causes_augmenting_path)
                score -= 1000000000;
            break;
        case Config::AvoidAugmentingPath::do_not_avoid:
            break;
        case Config::AvoidAugmentingPath::avoid_and_pick_oldest:
            if (causes_augmenting_path)
                score = -1000000000;
            break;
        case Config::AvoidAugmentingPath::avoid_and_pick_random:
            if (causes_augmenting_path)
                score = random_number() - 1000000000;
            break;
        default:
            assert(false);
            score = 0;
        }
        return score;
    }